

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_dimension_holders.h
# Opt level: O2

void __thiscall
Gudhi::persistence_matrix::Matrix_all_dimension_holder<int>::update_up
          (Matrix_all_dimension_holder<int> *this,uint dimension)

{
  uint in_EAX;
  ulong uVar1;
  pointer puVar2;
  undefined8 uStack_18;
  
  puVar2 = (this->dimensions_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar1 = (long)(this->dimensions_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)puVar2;
  if ((ulong)((long)uVar1 >> 2) <= (ulong)dimension) {
    uStack_18 = (ulong)in_EAX;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (&this->dimensions_,(ulong)(dimension + 1),
               (value_type_conflict1 *)((long)&uStack_18 + 4));
    puVar2 = (this->dimensions_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar1 = (long)(this->dimensions_).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)puVar2;
  }
  puVar2[dimension] = puVar2[dimension] + 1;
  this->maxDim_ = (int)(uVar1 >> 2) + -1;
  return;
}

Assistant:

void update_up(unsigned int dimension) {
    if (dimensions_.size() <= dimension) dimensions_.resize(dimension + 1, 0);
    ++(dimensions_[dimension]);
    maxDim_ = dimensions_.size() - 1;
  }